

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

Cnf_Dat_t * Cnf_DataAlloc(Aig_Man_t *pAig,int nVars,int nClauses,int nLiterals)

{
  Cnf_Dat_t *pCVar1;
  int **ppiVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  pCVar1 = (Cnf_Dat_t *)calloc(1,0x48);
  pCVar1->pMan = pAig;
  pCVar1->nVars = nVars;
  pCVar1->nClauses = nClauses;
  pCVar1->nLiterals = nLiterals;
  ppiVar2 = (int **)malloc((long)nClauses * 8 + 8);
  pCVar1->pClauses = ppiVar2;
  piVar3 = (int *)malloc((long)nLiterals * 4);
  *ppiVar2 = piVar3;
  ppiVar2[nClauses] = piVar3 + nLiterals;
  lVar5 = (long)pAig->vObjs->nSize;
  piVar3 = (int *)malloc(lVar5 * 4);
  pCVar1->pVarNums = piVar3;
  for (lVar4 = 0; lVar4 < lVar5; lVar4 = lVar4 + 1) {
    piVar3[lVar4] = -1;
  }
  return pCVar1;
}

Assistant:

Cnf_Dat_t * Cnf_DataAlloc( Aig_Man_t * pAig, int nVars, int nClauses, int nLiterals )
{
    Cnf_Dat_t * pCnf;
    int i;
    pCnf = ABC_ALLOC( Cnf_Dat_t, 1 );
    memset( pCnf, 0, sizeof(Cnf_Dat_t) );
    pCnf->pMan = pAig;
    pCnf->nVars = nVars;
    pCnf->nClauses = nClauses;
    pCnf->nLiterals = nLiterals;
    pCnf->pClauses = ABC_ALLOC( int *, nClauses + 1 );
    pCnf->pClauses[0] = ABC_ALLOC( int, nLiterals );
    pCnf->pClauses[nClauses] = pCnf->pClauses[0] + nLiterals;
    pCnf->pVarNums = ABC_ALLOC( int, Aig_ManObjNumMax(pAig) );
//    memset( pCnf->pVarNums, 0xff, sizeof(int) * Aig_ManObjNumMax(pAig) );
    for ( i = 0; i < Aig_ManObjNumMax(pAig); i++ )
        pCnf->pVarNums[i] = -1;
    return pCnf;
}